

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_len(Context *context,IntrinsicResult partialResult)

{
  ListStorage<MiniScript::TACLine> *pLVar1;
  long *plVar2;
  undefined4 *puVar3;
  anon_union_8_3_2f476f46_for_data this;
  Value val;
  Value local_98;
  long *local_88;
  char local_80;
  ValueDict local_78;
  Value local_60;
  Value local_50;
  Value local_40 [2];
  
  local_80 = '\0';
  plVar2 = (long *)operator_new(0x30);
  plVar2[1] = 1;
  *plVar2 = (long)&PTR__StringStorage_001d10b0;
  plVar2[3] = 5;
  plVar2[4] = -1;
  puVar3 = (undefined4 *)operator_new__(5);
  plVar2[2] = (long)puVar3;
  *(undefined1 *)(puVar3 + 1) = 0;
  *puVar3 = 0x666c6573;
  local_88 = plVar2;
  Context::GetVar((Context *)&local_98,(String *)partialResult.rs,(LocalOnlyMode)&local_88);
  if ((local_88 != (long *)0x0) && (local_80 == '\0')) {
    plVar2 = local_88 + 1;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*local_88 + 8))();
    }
    local_88 = (long *)0x0;
  }
  this = local_98.data;
  if (local_98.type == String) {
    if ((StringStorage *)local_98.data.ref == (StringStorage *)0x0) {
      this.number = 0.0;
    }
    else {
      (local_98.data.ref)->refCount = (local_98.data.ref)->refCount + 1;
    }
    if ((StringStorage *)this.ref == (StringStorage *)0x0) {
      local_50.data.number = 0.0;
    }
    else {
      if ((long)this.ref[2]._vptr_RefCountedStorage < 0) {
        StringStorage::analyzeChars((StringStorage *)this.ref);
      }
      local_50.data.number = (double)(long)this.ref[2]._vptr_RefCountedStorage;
    }
    local_50.type = Number;
    local_50.noInvoke = false;
    local_50.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_50);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_50.type) && (local_50.data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_50.data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_50.data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_50.data.number = 0.0;
    }
  }
  else {
    if (local_98.type == Map) {
      Value::GetDict(&local_78,&local_98);
      if (local_78.ds == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
        local_60.data.number = 0.0;
      }
      else {
        local_60.data.number = (double)(local_78.ds)->mSize;
      }
      local_60.type = Number;
      local_60.noInvoke = false;
      local_60.localOnly = Off;
      (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
      IntrinsicResult::ensureStorage((IntrinsicResult *)context);
      Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).
                                 mBuf,&local_60);
      *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems =
           1;
      if ((Temp < local_60.type) && (local_60.data.ref != (RefCountedStorage *)0x0)) {
        plVar2 = &(local_60.data.ref)->refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*(local_60.data.ref)->_vptr_RefCountedStorage[1])();
        }
        local_60.data.number = 0.0;
      }
      local_78._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001d1238;
      if ((local_78.ds != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
         (local_78.isTemp == false)) {
        plVar2 = &((local_78.ds)->super_RefCountedStorage).refCount;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (*((local_78.ds)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        local_78.ds = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
      }
      goto LAB_00152077;
    }
    if (local_98.type != List) {
      IntrinsicResult::ensureStorage((IntrinsicResult *)&IntrinsicResult::Null);
      pLVar1 = IntrinsicResult::Null;
      (context->code).ls = IntrinsicResult::Null;
      if (pLVar1 != (ListStorage<MiniScript::TACLine> *)0x0) {
        plVar2 = &(pLVar1->super_RefCountedStorage).refCount;
        *plVar2 = *plVar2 + 1;
      }
      goto LAB_00152077;
    }
    if ((StringStorage *)local_98.data.ref == (StringStorage *)0x0) {
      local_40[0].data.number = 0.0;
    }
    else {
      (local_98.data.ref)->refCount = (local_98.data.ref)->refCount + 1;
      local_40[0].data.number = (double)(long)local_98.data.ref[2]._vptr_RefCountedStorage;
    }
    local_40[0].type = Number;
    local_40[0].noInvoke = false;
    local_40[0].localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     local_40);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    if ((Temp < local_40[0].type) && (local_40[0].data.ref != (RefCountedStorage *)0x0)) {
      plVar2 = &(local_40[0].data.ref)->refCount;
      *plVar2 = *plVar2 + -1;
      if (*plVar2 == 0) {
        (*(local_40[0].data.ref)->_vptr_RefCountedStorage[1])();
      }
      local_40[0].data.number = 0.0;
    }
  }
  if ((StringStorage *)this.ref != (StringStorage *)0x0) {
    plVar2 = &(this.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)&(this.ref)->_vptr_RefCountedStorage)->_vptr_RefCountedStorage[1])
                (this.number);
    }
  }
LAB_00152077:
  if ((Temp < local_98.type) && ((StringStorage *)local_98.data.ref != (StringStorage *)0x0)) {
    plVar2 = &(local_98.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)&(local_98.data.ref)->_vptr_RefCountedStorage)->
        _vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_len(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::List) {
			ValueList list = val.GetList();
			return IntrinsicResult(list.Count());
		} else if (val.type == ValueType::String) {
			String str = val.GetString();
			return IntrinsicResult(str.Length());
		} else if (val.type == ValueType::Map) {
			return IntrinsicResult(val.GetDict().Count());
		}
		return IntrinsicResult::Null;
	}